

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

StructBuilder * __thiscall
capnp::_::OrphanBuilder::asStruct
          (StructBuilder *__return_storage_ptr__,OrphanBuilder *this,StructSize size)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  ushort uVar3;
  SegmentId id;
  CapTableBuilder *capTable;
  BuilderArena *this_00;
  word *pwVar4;
  SegmentBuilder *this_01;
  SegmentBuilder *pSVar5;
  SegmentBuilder *pSVar6;
  undefined8 *puVar7;
  OrphanBuilder *pOVar8;
  StructSize SVar13;
  StructSize SVar14;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  WirePointer *src;
  WirePointer *pWVar12;
  word *result;
  word *pwVar15;
  ushort uVar16;
  ulong uVar17;
  WirePointer *dst;
  AllocateResult AVar18;
  AllocateResult AVar19;
  AllocateResult AVar20;
  uint local_38;
  
  pSVar6 = this->segment;
  capTable = this->capTable;
  this_00 = (BuilderArena *)(pSVar6->super_SegmentReader).arena;
  uVar10 = (uint)size >> 0x10;
  uVar11 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  uVar9 = size.data;
  uVar16 = size.pointers;
  if (id.value != 0 || uVar11 != 0) {
    if ((uVar11 & 3) == 2) {
      this_01 = BuilderArena::getSegment(this_00,id);
      uVar11 = (uint)(this->tag).content;
      pwVar15 = (this_01->super_SegmentReader).ptr.ptr;
      uVar17 = (ulong)(uVar11 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar15->content + uVar17);
      pOVar8 = (OrphanBuilder *)((long)&pwVar15[1].content + uVar17);
      if ((uVar11 & 4) == 0) {
        pwVar15 = &pOVar8->tag + ((int)(pOVar1->tag).content >> 2);
        pOVar8 = pOVar1;
      }
      else {
        this_01 = BuilderArena::getSegment
                            ((BuilderArena *)(this_01->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pwVar15 = (word *)((long)&((this_01->super_SegmentReader).ptr.ptr)->content +
                          (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      pwVar15 = this->location;
      this_01 = pSVar6;
      pOVar8 = this;
    }
    AVar18.words = pwVar15;
    AVar18.segment = this_01;
    if (this_01->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_01);
    }
    if (((pOVar8->tag).content & 3) == 0) {
      uVar2 = *(ushort *)((long)&(pOVar8->tag).content + 4);
      uVar3 = *(ushort *)((long)&(pOVar8->tag).content + 6);
      uVar17 = (ulong)uVar3;
      src = (WirePointer *)(pwVar15 + uVar2);
      SVar14.pointers = 0;
      SVar14.data = uVar2;
      uVar11 = (uint)uVar3;
      pWVar12 = src;
      if (uVar3 < uVar16 || uVar2 < uVar9) {
        SVar13 = SVar14;
        if (uVar2 <= uVar9) {
          SVar13 = size;
        }
        if (uVar16 < uVar3) {
          uVar10 = uVar11;
        }
        uVar11 = uVar10;
        SVar14 = (StructSize)((uint)SVar13 & 0xffff);
        if ((((this->tag).content & 3) == 2) &&
           (pSVar5 = BuilderArena::getSegment
                               ((BuilderArena *)(pSVar6->super_SegmentReader).arena,
                                (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
           pSVar5->readOnly == false)) {
          uVar10 = (uint)(this->tag).content;
          puVar7 = (undefined8 *)
                   ((long)&((pSVar5->super_SegmentReader).ptr.ptr)->content +
                   (ulong)(uVar10 & 0xfffffff8));
          if ((uVar10 & 4) == 0) {
            *puVar7 = 0;
          }
          else {
            *puVar7 = 0;
            puVar7[1] = 0;
          }
        }
        uVar10 = uVar11 + (int)SVar14;
        (this->tag).content = 0;
        pOVar8 = this;
        if (this_00 == (BuilderArena *)0x0) {
          if (uVar10 == 0) {
            *(undefined4 *)&(this->tag).content = 0xfffffffc;
            AVar18.words = &this->tag;
            AVar18.segment = pSVar6;
          }
          else {
            pwVar4 = pSVar6->pos;
            AVar18.words = pwVar4;
            AVar18.segment = pSVar6;
            if (((long)((long)(pSVar6->super_SegmentReader).ptr.ptr +
                       ((pSVar6->super_SegmentReader).ptr.size_ * 8 - (long)pwVar4)) >> 3 <
                 (long)(ulong)uVar10) || (pSVar6->pos = pwVar4 + uVar10, pwVar4 == (word *)0x0)) {
              AVar18 = BuilderArena::allocate
                                 ((BuilderArena *)(pSVar6->super_SegmentReader).arena,uVar10 + 1);
              pOVar8 = (OrphanBuilder *)AVar18.words;
              pSVar6 = AVar18.segment;
              *(uint *)&(this->tag).content =
                   (int)AVar18.words - *(int *)&(pSVar6->super_SegmentReader).ptr.ptr & 0xfffffff8U
                   | 2;
              *(uint *)((long)&(this->tag).content + 4) = (pSVar6->super_SegmentReader).id.value;
              *(undefined4 *)&(pOVar8->tag).content = 0;
              AVar18.words = (word *)&pOVar8->segment;
              AVar18.segment = pSVar6;
            }
            else {
              *(uint *)&(this->tag).content =
                   ((uint)((ulong)((long)pwVar4 - (long)this) >> 1) & 0xfffffffc) - 4;
            }
          }
        }
        else {
          AVar18 = BuilderArena::allocate(this_00,uVar10);
          *(undefined4 *)&(this->tag).content = 0xfffffffc;
        }
        *(StructDataWordCount *)((long)&(pOVar8->tag).content + 4) = SVar13.data;
        *(short *)((long)&(pOVar8->tag).content + 6) = (short)uVar11;
        if (uVar2 != 0) {
          memcpy(AVar18.words,pwVar15,(ulong)uVar2 << 3);
        }
        pWVar12 = (WirePointer *)(AVar18.words + ((uint)SVar13 & 0xffff));
        dst = pWVar12;
        if (uVar3 != 0) {
          do {
            WireHelpers::transferPointer(AVar18.segment,dst,this_01,src);
            src = src + 1;
            uVar17 = uVar17 - 1;
            dst = dst + 1;
          } while (uVar17 != 0);
        }
        local_38 = (uint)uVar2;
        if (uVar3 + local_38 != 0) {
          memset(pwVar15,0,(ulong)((uVar3 + local_38) * 8));
        }
      }
      goto LAB_001c7696;
    }
    asStruct();
  }
  SVar14 = (StructSize)((uint)size & 0xffff);
  uVar11 = uVar10 + (int)SVar14;
  if (this_00 == (BuilderArena *)0x0) {
    if (*(int *)((long)&(this->tag).content + 4) != 0 || (int)(this->tag).content != 0) {
      WireHelpers::zeroObject(pSVar6,capTable,(WirePointer *)this);
    }
    if (uVar11 == 0) {
      *(undefined4 *)&(this->tag).content = 0xfffffffc;
      AVar20.words = &this->tag;
      AVar20.segment = pSVar6;
      pOVar8 = this;
    }
    else {
      pwVar15 = pSVar6->pos;
      AVar19.words = pwVar15;
      AVar19.segment = pSVar6;
      if (((long)(ulong)uVar11 <=
           (long)((long)(pSVar6->super_SegmentReader).ptr.ptr +
                 ((pSVar6->super_SegmentReader).ptr.size_ * 8 - (long)pwVar15)) >> 3) &&
         (pSVar6->pos = pwVar15 + uVar11, pwVar15 != (word *)0x0)) {
        *(uint *)&(this->tag).content =
             ((uint)((ulong)((long)pwVar15 - (long)this) >> 1) & 0xfffffffc) - 4;
        goto LAB_001c7684;
      }
      AVar20 = BuilderArena::allocate
                         ((BuilderArena *)(pSVar6->super_SegmentReader).arena,uVar11 + 1);
      *(uint *)&(this->tag).content =
           (int)AVar20.words - *(int *)&((AVar20.segment)->super_SegmentReader).ptr.ptr &
           0xfffffff8U | 2;
      *(uint *)((long)&(this->tag).content + 4) = ((AVar20.segment)->super_SegmentReader).id.value;
      *(undefined4 *)&(AVar20.words)->content = 0;
      pOVar8 = (OrphanBuilder *)(AVar20.words + 1);
    }
  }
  else {
    AVar19 = BuilderArena::allocate(this_00,uVar11);
    *(undefined4 *)&(this->tag).content = 0xfffffffc;
LAB_001c7684:
    AVar20.words = &this->tag;
    AVar20.segment = AVar19.segment;
    pOVar8 = (OrphanBuilder *)AVar19.words;
  }
  AVar18.words = &pOVar8->tag;
  AVar18.segment = AVar20.segment;
  *(ushort *)((long)&(AVar20.words)->content + 4) = uVar9;
  *(ushort *)((long)&(AVar20.words)->content + 6) = uVar16;
  pWVar12 = (WirePointer *)(&pOVar8->tag + (uint)SVar14);
  uVar11 = uVar10;
LAB_001c7696:
  __return_storage_ptr__->segment = AVar18.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->data = AVar18.words;
  __return_storage_ptr__->pointers = pWVar12;
  __return_storage_ptr__->dataSize = (int)SVar14 << 6;
  __return_storage_ptr__->pointerCount = (StructPointerCount)uVar11;
  this->location = AVar18.words;
  return __return_storage_ptr__;
}

Assistant:

StructBuilder OrphanBuilder::asStruct(StructSize size) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  StructBuilder result = WireHelpers::getWritableStructPointer(
      tagAsPtr(), location, segment, capTable, size, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = reinterpret_cast<word*>(result.data);

  return result;
}